

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.cpp
# Opt level: O3

void __thiscall argparse::args_t::args_t(args_t *this,int argc,char **argv)

{
  byte bVar1;
  int iVar2;
  FILE *pFVar3;
  undefined4 in_register_00000034;
  char *str;
  char *str_00;
  args_t *paVar4;
  char *__s1;
  int iVar5;
  
  str_00 = (char *)CONCAT44(in_register_00000034,argc);
  this->output = (FILE *)_stdout;
  this->input1 = _stdin;
  this->input2 = (FILE *)0x0;
  this->distance = 0.015;
  this->min_distance = -1e-10;
  this->ambig = resolve;
  this->format = csv;
  this->overlap = 100;
  this->do_bootstrap = false;
  this->do_bootstrap_two_files = false;
  this->do_count = false;
  this->quiet = false;
  this->quiet = false;
  this->do_fst = false;
  this->skip_header = false;
  this->report_self = false;
  this->counts_in_name = ':';
  this->include_prob = 1.0;
  this->ambigs_to_resolve = (char *)0x0;
  this->resolve_fraction = 1.0;
  this->delimiter = ',';
  if (1 < argc) {
    iVar5 = 1;
    __s1 = (char *)this;
    do {
      str = argv[iVar5];
      if (*str == '-') {
        bVar1 = str[1];
        if (bVar1 < 0x61) {
          if (bVar1 == 0x30) {
            this->report_self = true;
          }
          else {
            if (bVar1 != 0x44) {
              if (bVar1 == 0x2d) {
                __s1 = str + 2;
                str_00 = "help";
                paVar4 = (args_t *)__s1;
                iVar2 = strcmp(__s1,"help");
                if (iVar2 == 0) goto LAB_00109559;
                str_00 = "version";
                iVar2 = strcmp(__s1,"version");
                if (iVar2 == 0) goto LAB_00109554;
              }
              goto switchD_00109241_caseD_65;
            }
            iVar5 = iVar5 + 1;
            if (iVar5 == argc) {
              ERROR("ran out of command line arguments");
            }
            str_00 = argv[iVar5];
            __s1 = (char *)this;
            parse_delimiter(this,str_00);
          }
        }
        else {
          paVar4 = (args_t *)__s1;
          switch(bVar1) {
          case 0x61:
            iVar5 = iVar5 + 1;
            if (iVar5 == argc) {
              ERROR("ran out of command line arguments");
            }
            str_00 = argv[iVar5];
            __s1 = (char *)this;
            parse_ambig(this,str_00);
            break;
          case 0x62:
            this->do_bootstrap = true;
            break;
          case 99:
            this->do_count = true;
            break;
          case 100:
            iVar5 = iVar5 + 1;
            if (iVar5 == argc) {
              ERROR("ran out of command line arguments");
            }
            str_00 = argv[iVar5];
            __s1 = (char *)this;
            parse_counts_in_name(this,str_00);
            break;
          case 0x66:
            iVar5 = iVar5 + 1;
            if (iVar5 == argc) {
              ERROR("ran out of command line arguments");
            }
            str_00 = argv[iVar5];
            __s1 = (char *)this;
            parse_format(this,str_00);
            break;
          case 0x67:
            iVar5 = iVar5 + 1;
            if (iVar5 == argc) {
              ERROR("ran out of command line arguments");
            }
            str_00 = argv[iVar5];
            __s1 = (char *)this;
            parse_fraction(this,str_00);
            break;
          case 0x68:
            if (str[2] == '\0') {
              argparse::args_t();
LAB_00109554:
              argparse::args_t();
              paVar4 = (args_t *)__s1;
LAB_00109559:
              argparse::args_t();
switchD_00109241_caseD_76:
              argparse::args_t();
              pFVar3 = _stdout;
              if ((str_00 != (char *)0x0) && ((*str_00 != '-' || (str_00[1] != '\0')))) {
                pFVar3 = fopen(str_00,"wb");
              }
              paVar4->output = (FILE *)pFVar3;
              if (pFVar3 != (FILE *)0x0) {
                return;
              }
              ERROR("failed to open the OUTPUT file %s",str_00);
              return;
            }
          default:
switchD_00109241_caseD_65:
            __s1 = "unknown argument: %s";
            ERROR("unknown argument: %s");
            str_00 = str;
            break;
          case 0x6c:
            iVar5 = iVar5 + 1;
            if (iVar5 == argc) {
              ERROR("ran out of command line arguments");
            }
            str_00 = argv[iVar5];
            __s1 = (char *)this;
            parse_overlap(this,str_00);
            break;
          case 0x6d:
            this->do_fst = true;
            break;
          case 0x6e:
            this->skip_header = true;
            break;
          case 0x6f:
            iVar5 = iVar5 + 1;
            if (iVar5 == argc) {
              ERROR("ran out of command line arguments");
            }
            str_00 = argv[iVar5];
            __s1 = (char *)this;
            parse_output(this,str_00);
            break;
          case 0x71:
            this->quiet = true;
            break;
          case 0x72:
            this->do_bootstrap_two_files = true;
            break;
          case 0x73:
            iVar5 = iVar5 + 1;
            if (iVar5 == argc) {
              ERROR("ran out of command line arguments");
            }
            str_00 = argv[iVar5];
            __s1 = (char *)this;
            parse_second_in(this,str_00);
            break;
          case 0x74:
            iVar5 = iVar5 + 1;
            if (iVar5 == argc) {
              ERROR("ran out of command line arguments");
            }
            str_00 = argv[iVar5];
            __s1 = (char *)this;
            parse_distance(this,str_00);
            break;
          case 0x75:
            iVar5 = iVar5 + 1;
            if (iVar5 == argc) {
              ERROR("ran out of command line arguments");
            }
            str_00 = argv[iVar5];
            __s1 = (char *)this;
            parse_include_prob(this,str_00);
            break;
          case 0x76:
            goto switchD_00109241_caseD_76;
          case 0x77:
            iVar5 = iVar5 + 1;
            if (iVar5 == argc) {
              ERROR("ran out of command line arguments");
            }
            str_00 = argv[iVar5];
            __s1 = (char *)this;
            parse_min_distance(this,str_00);
          }
        }
      }
      else {
        if (iVar5 != argc + -1) goto switchD_00109241_caseD_65;
        __s1 = (char *)this;
        parse_input(this,str);
        str_00 = str;
        iVar5 = argc + -1;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
  return;
}

Assistant:

args_t::args_t( int argc, const char * argv[] ) :
  output( stdout ),
  input1( stdin ),
  input2( NULL ),
  distance( DEFAULT_DISTANCE ),
  min_distance( DEFAULT_MIN_DISTANCE ),
  ambig( DEFAULT_AMBIG ),
  format ( DEFAULT_FORMAT ),
  overlap ( DEFAULT_OVERLAP ),
  do_bootstrap( false ),
  do_bootstrap_two_files ( false ),
  do_count( false ),
  quiet( false ),
  do_fst( false ),
  skip_header ( false ),
  report_self ( false ),
  counts_in_name ( DEFAULT_COUNTS_IN_NAME ),
  include_prob( DEFAULT_INCLUDE_PROB ),
  ambigs_to_resolve(NULL),
  resolve_fraction(DEFAULT_FRACTION),
  delimiter (DEFAULT_DELIMITER)
  {
      // skip arg[0], it's just the program name
    for (int i = 1; i < argc; ++i ) {
      const char * arg = argv[i];
      
      if ( arg[0] == '-' && arg[1] == '-' ) {
        if ( !strcmp( &arg[2], "help" ) ) help();
        else if ( !strcmp( &arg[2], "version" ) ) version();
        else
          ERROR( "unknown argument: %s", arg );
      }
      else if ( arg[0] == '-' ) {
        if ( !strcmp( &arg[1], "h" ) ) help();
        else if (  arg[1] == 'v' ) version();
        else if (  arg[1] == 'o' ) parse_output( next_arg (i, argc, argv) );
        else if (  arg[1] == 't' ) parse_distance ( next_arg (i, argc, argv) );
        else if (  arg[1] == 'w' ) parse_min_distance ( next_arg (i, argc, argv) );
        else if (  arg[1] == 'l')  parse_overlap( next_arg (i, argc, argv) );
        else if (  arg[1] == 'f')  parse_format( next_arg (i, argc, argv) );
        else if (  arg[1] == 'a')  parse_ambig( next_arg (i, argc, argv) );
        else if (  arg[1] == 's')  parse_second_in( next_arg (i, argc, argv) );
        else if (  arg[1] == 'd')  parse_counts_in_name( next_arg (i, argc, argv) );
        else if (  arg[1] == 'u')  parse_include_prob( next_arg (i, argc, argv) );
        else if (  arg[1] == 'D')  parse_delimiter ( next_arg (i, argc, argv) );
        else if (  arg[1] == 'b')  parse_bootstrap();
        else if (  arg[1] == 'r')  parse_bootstrap_two_files ();
        else if (  arg[1] == 'c')  parse_count();
        else if (  arg[1] == 'n')  parse_no_header ();
        else if (  arg[1] == 'q')  parse_quiet();
        else if (  arg[1] == 'm')  parse_fst();
        else if (  arg[1] == '0')  parse_report_self();
        else if (  arg[1] == 'g')  parse_fraction( next_arg (i, argc, argv) );
        else
          ERROR( "unknown argument: %s", arg );
      }
      else
        if (i == argc-1) {
          parse_input (arg);
        } else {
          ERROR( "unknown argument: %s", arg );
        }
    }
  }